

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

string * __thiscall pbrt::Interval<double>::ToString_abi_cxx11_(Interval<double> *this)

{
  string *in_RDI;
  double *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<double_const&,double_const&>(in_stack_00000018,in_stack_00000010,&this->low);
  return in_RDI;
}

Assistant:

std::string Interval<Float>::ToString() const {
    return StringPrintf("[ Interval [%f, %f] ]", low, high);
}